

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_invalid_address.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2787df::InvalidAddress_throw_invalid_address_Test::TestBody
          (InvalidAddress_throw_invalid_address_Test *this)

{
  InvalidAddress *this_00;
  AssertionResult gtest_ar;
  InvalidAddress *e;
  allocator<char> local_31;
  string local_30 [8];
  string expected;
  InvalidAddress_throw_invalid_address_Test *this_local;
  
  expected.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"Invalid address [0xABCD]",&local_31);
  std::allocator<char>::~allocator(&local_31);
  this_00 = (InvalidAddress *)__cxa_allocate_exception(0x28);
  n_e_s::core::InvalidAddress::InvalidAddress(this_00,0xabcd);
  __cxa_throw(this_00,&n_e_s::core::InvalidAddress::typeinfo,
              n_e_s::core::InvalidAddress::~InvalidAddress);
}

Assistant:

TEST(InvalidAddress, throw_invalid_address) {
    std::string expected("Invalid address [0xABCD]");

    try {
        throw InvalidAddress(0xABCD);
    } catch (const InvalidAddress &e) {
        EXPECT_STREQ(e.what(), expected.c_str());
    }
}